

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-operations.h
# Opt level: O0

size_t bitset_log2(ndn_bitset_t val)

{
  int iVar1;
  uint uVar2;
  ndn_bitset_t val_local;
  
  iVar1 = 0;
  for (uVar2 = (uint)val; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x80000000) {
    iVar1 = iVar1 + 1;
  }
  return (long)iVar1;
}

Assistant:

static inline size_t bitset_log2(ndn_bitset_t val){
#if defined(__GNUC__) || defined(__clang__)
  return __builtin_ctz(val);
#else
  size_t n = 0;
  if((x & 0x00000000FFFFFFFFllu) == 0){
    n += 32;
    val >>= 32llu;
  }
  if((x & 0x000000000000FFFFllu) == 0){
    n += 16;
    val >>= 16llu;
  }
  if((x & 0x00000000000000FFllu) == 0){
    n += 8;
    val >>= 8llu;
  }
  if((x & 0x000000000000000Fllu) == 0){
    n += 4;
    val >>= 4llu;
  }
  if((x & 0x0000000000000003llu) == 0){
    n += 2;
    val >>= 2llu;
  }
  if((x & 0x0000000000000001llu) == 0){
    n += 1;
  }
  return n;
#endif
}